

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_prettyPrintSpacesWrongPlaceNewlines_Test::~Printer_prettyPrintSpacesWrongPlaceNewlines_Test
          (Printer_prettyPrintSpacesWrongPlaceNewlines_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Printer, prettyPrintSpacesWrongPlaceNewlines)
{
    auto printer = libcellml::Printer::create();
    auto model = libcellml::Model::create();
    model->setName("model");

    auto component6 = libcellml::Component::create("component");
    model->addComponent(component6);
    const std::string equation6 =
        "<apply><eq/>\n"
        "  <apply><diff/>\n"
        "    <bvar><ci>t</ci></bvar>\n"
        "    <ci>X</ci>\n"
        "  </apply>\n"
        "  <apply><minus/>\n"
        "    <apply><times/>\n"
        "      <ci>alpha_X</ci>\n"
        "      <apply><minus/>\n"
        "        <cn cellml:units=\"dimensionless\">1</cn>\n"
        "        <ci>X</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "    <apply><times/>\n"
        "      <ci>beta_X</ci>\n"
        "      <ci>X</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>\n";
    component6->setMath(MATH_HEADER);
    component6->appendMath(equation6);
    component6->appendMath(MATH_FOOTER);
    EXPECT_EQ(PRETTY_MODEL_STRING, printer->printModel(model));
}